

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

bool __thiscall ON_BinaryArchive::BeginWrite3dmChunk(ON_BinaryArchive *this,uint typecode,int value)

{
  bool bVar1;
  
  if (value == 0) {
    bVar1 = BeginWrite3dmBigChunk(this,typecode,0);
    return bVar1;
  }
  if ((int)typecode < 0) {
    if ((int)typecode < -0x7dffff8f) {
      if ((typecode != 0x80400001) && (typecode != 0x80400006)) {
LAB_0039c7e6:
        bVar1 = BeginWrite3dmBigChunk(this,typecode,(long)value);
        return bVar1;
      }
    }
    else if ((typecode != 0x82000071) && (typecode != 0xa0000026)) goto LAB_0039c7e6;
  }
  bVar1 = BeginWrite3dmBigChunk(this,typecode,(ulong)(uint)value);
  return bVar1;
}

Assistant:

bool ON_BinaryArchive::BeginWrite3dmChunk( unsigned int typecode, int value )
{
  ON__INT64 value64 = 0;
  if ( 0 != value )
  {
    if ( ON_IsUnsignedChunkTypecode(typecode) )
    {
      // treat value parameter as an unsigned int
      ON__UINT32 u32 = (ON__UINT32)value;
      ON__UINT64 u64 = u32;
      value64 = (ON__INT64)u64;
    }
    else
    {
      // treat value paramter is a signed int
      value64 = value;
    }
  }
  return BeginWrite3dmBigChunk(typecode,value64);
}